

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.c
# Opt level: O0

rt_function_error_t exec_deconvolution(rt_function_t *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  long *plVar8;
  void *__s;
  bool bVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t shape_01;
  rt_list_t shape_02;
  rt_list_t out;
  rt_list_t out_00;
  rt_list_t shape_03;
  rt_list_t shape_04;
  rt_list_t shape_05;
  rt_list_t pos;
  int local_6c;
  int o_1;
  float w;
  float x;
  int k1;
  int j;
  float fStack_50;
  uint8_t condition;
  int k;
  float sum;
  int o;
  int kernel_offset;
  int input_offset;
  int im;
  int output_offset;
  int om;
  int g;
  int b;
  int input_size;
  int kernel_size;
  int output_size;
  deconvolution_private_t *p;
  deconvolution_local_context_t *c;
  rt_function_t *f_local;
  
  plVar7 = (long *)f->local_context;
  plVar8 = (long *)*plVar7;
  shape._4_4_ = 0;
  shape.size = *(uint *)(plVar8 + 0xb);
  shape.data = (int *)plVar8[0xc];
  iVar11 = calc_shape_size(shape);
  shape_00._4_4_ = 0;
  shape_00.size = *(uint *)(plVar8 + 0xd);
  shape_00.data = (int *)plVar8[0xe];
  iVar12 = calc_shape_size(shape_00);
  shape_01._4_4_ = 0;
  shape_01.size = *(uint *)(plVar8 + 9);
  shape_01.data = (int *)plVar8[10];
  iVar13 = calc_shape_size(shape_01);
  __s = *(void **)(plVar8[6] + 0x18);
  shape_02._4_4_ = 0;
  shape_02.size = *(uint *)plVar8[6];
  shape_02.data = *(int **)((uint *)plVar8[6] + 2);
  iVar14 = calc_shape_size(shape_02);
  memset(__s,0,(long)iVar14 << 2);
  om = 0;
  do {
    if (*(int *)((long)plVar8 + 0x9c) <= om) {
      return RT_FUNCTION_ERROR_NOERROR;
    }
    for (output_offset = 0; output_offset < (int)plVar7[8]; output_offset = output_offset + 1) {
      for (im = 0; im < *(int *)(*(long *)(plVar8[2] + 8) + 4); im = im + 1) {
        iVar14 = (om * (int)plVar7[8] * *(int *)(*(long *)(plVar8[2] + 8) + 4) +
                  output_offset * *(int *)(*(long *)(plVar8[2] + 8) + 4) + im) * iVar11;
        for (kernel_offset = 0; kernel_offset < **(int **)(plVar8[2] + 8) / (int)plVar7[8];
            kernel_offset = kernel_offset + 1) {
          iVar1 = **(int **)(plVar8[2] + 8);
          iVar2 = **(int **)(plVar8[2] + 8);
          lVar17 = plVar7[8];
          iVar3 = *(int *)(*(long *)(plVar8[2] + 8) + 4);
          iVar4 = **(int **)(plVar8[2] + 8);
          lVar10 = plVar7[8];
          iVar5 = *(int *)(*(long *)(plVar8[2] + 8) + 4);
          for (k = 0; k < iVar11; k = k + 1) {
            fStack_50 = 0.0;
            out._4_4_ = 0;
            out.size = *(uint *)(plVar8 + 0x11);
            shape_04._4_4_ = 0;
            shape_04.size = *(uint *)(plVar8 + 0xb);
            out.data = (int *)plVar8[0x12];
            shape_04.data = (int *)plVar8[0xc];
            pos_to_shape(out,shape_04,k);
            for (j = 0; j < iVar12; j = j + 1) {
              out_00._4_4_ = 0;
              out_00.size = *(uint *)(plVar8 + 0xf);
              shape_05._4_4_ = 0;
              shape_05.size = *(uint *)(plVar8 + 0xd);
              out_00.data = (int *)plVar8[0x10];
              shape_05.data = (int *)plVar8[0xe];
              pos_to_shape(out_00,shape_05,j);
              bVar9 = true;
              for (x = 0.0; (int)x < (int)plVar8[0x13]; x = (float)((int)x + 1)) {
                iVar15 = *(int *)(plVar7[7] + (long)(int)x * 4);
                iVar6 = *(int *)(plVar8[0xe] + (long)(int)x * 4);
                *(int *)(plVar8[0x10] + (long)(int)x * 4) =
                     *(int *)(plVar7[7] + (long)(int)x * 4) *
                     *(int *)(plVar8[0x10] + (long)(int)x * 4);
                *(int *)(plVar8[0x10] + (long)(int)x * 4) =
                     *(int *)(plVar8[0x10] + (long)(int)x * 4) -
                     (iVar15 * (iVar6 + -1) - *(int *)(plVar7[3] + (long)(int)x * 4));
                *(int *)(plVar8[0x10] + (long)(int)x * 4) =
                     *(int *)(plVar8[0x12] + (long)(int)x * 4) +
                     *(int *)(plVar8[0x10] + (long)(int)x * 4);
                if (*(int *)(plVar8[0x10] + (long)(int)x * 4) %
                    *(int *)(plVar7[5] + (long)(int)x * 4) != 0) {
                  bVar9 = false;
                  break;
                }
                *(int *)(plVar8[0x10] + (long)(int)x * 4) =
                     *(int *)(plVar8[0x10] + (long)(int)x * 4) /
                     *(int *)(plVar7[5] + (long)(int)x * 4);
                if ((*(int *)(plVar8[0x10] + (long)(int)x * 4) < 0) ||
                   (*(int *)(plVar8[10] + (long)(int)x * 4) <=
                    *(int *)(plVar8[0x10] + (long)(int)x * 4))) {
                  bVar9 = false;
                  break;
                }
              }
              if (bVar9) {
                lVar16 = *(long *)(*plVar8 + 0x18);
                shape_03._4_4_ = 0;
                shape_03.size = *(uint *)(plVar8 + 9);
                pos._4_4_ = 0;
                pos.size = *(uint *)(plVar8 + 0xf);
                shape_03.data = (int *)plVar8[10];
                pos.data = (int *)plVar8[0x10];
                iVar15 = shape_to_pos(shape_03,pos);
                fStack_50 = *(float *)(lVar16 + (long)((om * iVar1 +
                                                        (output_offset * iVar2) / (int)lVar17 +
                                                       kernel_offset) * iVar13) * 4 +
                                      (long)iVar15 * 4) *
                            *(float *)(*(long *)(plVar8[2] + 0x18) +
                                       (long)(((output_offset * iVar3 * iVar4) / (int)lVar10 +
                                               kernel_offset * iVar5 + im) * iVar12) * 4 +
                                      (long)((iVar12 - j) + -1) * 4) + fStack_50;
              }
            }
            lVar16 = *(long *)(plVar8[6] + 0x18) + (long)iVar14 * 4;
            *(float *)(lVar16 + (long)k * 4) = fStack_50 + *(float *)(lVar16 + (long)k * 4);
          }
        }
        if (plVar8[4] != 0) {
          for (local_6c = 0; local_6c < iVar11; local_6c = local_6c + 1) {
            lVar17 = *(long *)(plVar8[6] + 0x18) + (long)iVar14 * 4;
            *(float *)(lVar17 + (long)local_6c * 4) =
                 *(float *)(*(long *)(plVar8[4] + 0x18) +
                            (long)(output_offset * *(int *)(*(long *)(plVar8[2] + 8) + 4)) * 4 +
                           (long)im * 4) + *(float *)(lVar17 + (long)local_6c * 4);
          }
        }
      }
    }
    om = om + 1;
  } while( true );
}

Assistant:

rt_function_error_t exec_deconvolution(rt_function_t *f) {
  deconvolution_local_context_t *c =
      (deconvolution_local_context_t *)(f->local_context);
  deconvolution_private_t *p = (deconvolution_private_t *)(c->data);

  int output_size = calc_shape_size(p->output_shape);
  int kernel_size = calc_shape_size(p->kernel_shape);
  int input_size = calc_shape_size(p->input_shape);

  memset(p->output->data, 0, sizeof(float) * calc_shape_size(p->output->shape));

  for (int b = 0; b < p->base_loop_size; b++) {
    for (int g = 0; g < c->group; g++) {
      for (int om = 0; om < p->weight->shape.data[1]; om++) {
        int output_offset = (b * c->group * p->weight->shape.data[1] +
                             g * p->weight->shape.data[1] + om) *
                            output_size;
        for (int im = 0; im < p->weight->shape.data[0] / c->group; im++) {
          int input_offset = (b * p->weight->shape.data[0] +
                              g * p->weight->shape.data[0] / c->group + im) *
                             input_size;
          int kernel_offset = (g * p->weight->shape.data[1] *
                                   p->weight->shape.data[0] / c->group +
                               im * p->weight->shape.data[1] + om) *
                              kernel_size;
          for (int o = 0; o < output_size; o++) {
            float sum = 0.0f;
            pos_to_shape(p->out_position, p->output_shape, o);
            for (int k = 0; k < kernel_size; k++) {
              pos_to_shape(p->in_position, p->kernel_shape, k);
              uint8_t condition = 1;
              for (int j = 0; j < p->spatial_dims; j++) {
                int k1 =
                    c->dilation.data[j] * (p->kernel_shape.data[j] - 1) + 1;
                p->in_position.data[j] *= c->dilation.data[j];
                p->in_position.data[j] -= k1 - c->pad.data[j] - 1;
                p->in_position.data[j] += p->out_position.data[j];
                if (p->in_position.data[j] % c->stride.data[j] != 0) {
                  condition = 0;
                  break;
                }
                p->in_position.data[j] =
                    p->in_position.data[j] / c->stride.data[j];
                if (p->in_position.data[j] < 0 ||
                    p->in_position.data[j] >= p->input_shape.data[j]) {
                  condition = 0;
                  break;
                }
              }
              if (condition) {
                float x = *((float *)(p->input->data) + input_offset +
                            shape_to_pos(p->input_shape, p->in_position));
                float w = *((float *)(p->weight->data) + kernel_offset +
                            (kernel_size - k - 1));
                sum += x * w;
              }
            }
            *((float *)(p->output->data) + output_offset + o) += sum;
          }
        }
        if (p->bias) {
          for (int o = 0; o < output_size; o++) {
            *((float *)(p->output->data) + output_offset + o) +=
                *((float *)(p->bias->data) + g * p->weight->shape.data[1] + om);
          }
        }
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}